

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::Seal
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance)

{
  int iVar1;
  BOOL BVar2;
  IndexPropertyDescriptorMap *pIVar3;
  IndexPropertyDescriptor *pIVar4;
  int local_24;
  int i;
  IndexPropertyDescriptor *descriptor;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  local_24 = 0;
  while( true ) {
    pIVar3 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                       (&this->indexPropertyMap);
    iVar1 = IndexPropertyDescriptorMap::Count(pIVar3);
    if (iVar1 <= local_24) break;
    pIVar3 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                       (&this->indexPropertyMap);
    pIVar4 = IndexPropertyDescriptorMap::GetReferenceAt(pIVar3,local_24);
    pIVar4->Attributes = pIVar4->Attributes & 0xfd;
    local_24 = local_24 + 1;
  }
  SetDataItemSealed(this);
  BVar2 = DictionaryTypeHandlerBase<unsigned_short>::Seal
                    (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance);
  return BVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::Seal(DynamicObject* instance)
    {
        IndexPropertyDescriptor* descriptor = NULL;
        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            descriptor = indexPropertyMap->GetReferenceAt(i);
            descriptor->Attributes &= (~PropertyConfigurable);
        }

        this->SetDataItemSealed(); // set shared data item attributes sealed

        return __super::Seal(instance);
    }